

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_left_predictor_64x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 uVar7;
  byte bVar8;
  undefined1 uVar9;
  byte bVar10;
  undefined1 uVar11;
  byte bVar12;
  undefined1 uVar13;
  byte bVar14;
  __m128i row;
  
  auVar5 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])left);
  uVar1 = auVar5._8_2_ + auVar5._0_2_ + 8;
  uVar2 = auVar5._10_2_ + auVar5._2_2_ + 8;
  uVar3 = auVar5._12_2_ + auVar5._4_2_ + 8;
  uVar4 = auVar5._14_2_ + auVar5._6_2_ + 8;
  uVar7 = (undefined1)(uVar1 >> 4);
  bVar8 = (byte)(uVar1 >> 0xc);
  uVar9 = (undefined1)(uVar2 >> 4);
  bVar10 = (byte)(uVar2 >> 0xc);
  uVar11 = (undefined1)(uVar3 >> 4);
  bVar12 = (byte)(uVar3 >> 0xc);
  uVar13 = (undefined1)(uVar4 >> 4);
  bVar14 = (byte)(uVar4 >> 0xc);
  auVar6[1] = uVar7;
  auVar6[0] = uVar7;
  auVar6[2] = bVar8;
  auVar6[3] = bVar8;
  auVar6[4] = uVar9;
  auVar6[5] = uVar9;
  auVar6[6] = bVar10;
  auVar6[7] = bVar10;
  auVar6[8] = uVar11;
  auVar6[9] = uVar11;
  auVar6[10] = bVar12;
  auVar6[0xb] = bVar12;
  auVar6[0xc] = uVar13;
  auVar6[0xd] = uVar13;
  auVar6[0xe] = bVar14;
  auVar6[0xf] = bVar14;
  auVar6 = pshuflw(auVar5,auVar6,0);
  row[0]._0_4_ = auVar6._0_4_;
  row[0]._4_4_ = (undefined4)row[0];
  row[1]._0_4_ = (undefined4)row[0];
  row[1]._4_4_ = (undefined4)row[0];
  dc_store_64xh(&row,0x10,dst,stride);
  return;
}

Assistant:

void aom_dc_left_predictor_64x16_sse2(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above,
                                      const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_16_sse2(left);
  const __m128i eight = _mm_set1_epi16(8);
  sum_left = _mm_add_epi16(sum_left, eight);
  sum_left = _mm_srai_epi16(sum_left, 4);
  sum_left = _mm_unpacklo_epi8(sum_left, sum_left);
  sum_left = _mm_shufflelo_epi16(sum_left, 0);
  const __m128i row = _mm_unpacklo_epi64(sum_left, sum_left);
  dc_store_64xh(&row, 16, dst, stride);
}